

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall BN::mulbaseappr(BN *this,bt *multiplier)

{
  ushort *puVar1;
  ushort *puVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  uint local_c;
  
  if (*multiplier == 0) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,1);
    *(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
     super__Vector_impl_data._M_start = 0;
  }
  else {
    puVar1 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_c = 0;
    for (puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
      local_c = (uint)*multiplier * (uint)*puVar2 + local_c;
      *puVar2 = (ushort)local_c;
      local_c = local_c >> 0x10;
    }
    if (local_c != 0) {
      std::vector<unsigned_short,std::allocator<unsigned_short>>::emplace_back<unsigned_int&>
                ((vector<unsigned_short,std::allocator<unsigned_short>> *)this,&local_c);
    }
  }
  return this;
}

Assistant:

BN& BN::mulbaseappr(const bt &multiplier)
{
    if (!multiplier) {
        ba.resize(1);
        ba.front() = 0;
        return *this;
    }

    bt2 curr = 0;
    for(auto& i : ba) {
        i = curr += static_cast<bt2>(i) * multiplier;
        curr >>= bz8;
    }
    if (curr)
        ba.emplace_back(curr);
    return *this;
}